

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ArrayType,_std::default_delete<wabt::ArrayType>_> __thiscall
wabt::MakeUnique<wabt::ArrayType,std::__cxx11::string&>
          (wabt *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  ArrayType *this_00;
  string_view local_28;
  string *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  
  local_18 = args;
  args_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  this_00 = (ArrayType *)operator_new(0x78);
  string_view::string_view(&local_28,local_18);
  ArrayType::ArrayType(this_00,local_28);
  std::unique_ptr<wabt::ArrayType,std::default_delete<wabt::ArrayType>>::
  unique_ptr<std::default_delete<wabt::ArrayType>,void>
            ((unique_ptr<wabt::ArrayType,std::default_delete<wabt::ArrayType>> *)this,this_00);
  return (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)
         (__uniq_ptr_data<wabt::ArrayType,_std::default_delete<wabt::ArrayType>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}